

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedersen_impl.h
# Opt level: O1

void secp256k1_pedersen_ecmult
               (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_gej *rj,secp256k1_scalar *sec
               ,uint64_t value,secp256k1_ge *genp)

{
  secp256k1_fe *rzr;
  secp256k1_gej vj;
  secp256k1_gej sStack_a8;
  
  rzr = (secp256k1_fe *)value;
  secp256k1_ecmult_gen(ecmult_gen_ctx,rj,sec);
  secp256k1_pedersen_ecmult_small(&sStack_a8,value,genp);
  secp256k1_gej_add_var(rj,rj,&sStack_a8,rzr);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_pedersen_ecmult(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_gej *rj, const secp256k1_scalar *sec, uint64_t value, const secp256k1_ge* genp) {
    secp256k1_gej vj;
    secp256k1_ecmult_gen(ecmult_gen_ctx, rj, sec);
    secp256k1_pedersen_ecmult_small(&vj, value, genp);
    /* FIXME: constant time. */
    secp256k1_gej_add_var(rj, rj, &vj, NULL);
    secp256k1_gej_clear(&vj);
}